

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZEigenAnalysis.cpp
# Opt level: O0

void __thiscall TPZEigenAnalysis::TPZEigenAnalysis(TPZEigenAnalysis *this)

{
  TPZRegisterClassId *in_RDI;
  TPZFMatrix<std::complex<double>_> *unaff_retaddr;
  int64_t in_stack_00000028;
  void **in_stack_000000c8;
  TPZAnalysis *in_stack_000000d0;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZEigenAnalysis>(in_RDI,0x21);
  TPZAnalysis::TPZAnalysis(in_stack_000000d0,in_stack_000000c8);
  *(undefined ***)in_RDI = &PTR__TPZEigenAnalysis_0252c740;
  TPZManVector<std::complex<double>,_10>::TPZManVector
            ((TPZManVector<std::complex<double>,_10> *)this,in_stack_00000028);
  TPZFMatrix<std::complex<double>_>::TPZFMatrix(unaff_retaddr);
  in_RDI[0x498] = (TPZRegisterClassId)0x1;
  return;
}

Assistant:

TPZEigenAnalysis::TPZEigenAnalysis()
  : TPZRegisterClassId(&TPZEigenAnalysis::ClassId),TPZAnalysis()
{

}